

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::builder_swap_before_finish_test
               (bool run)

{
  Color CVar1;
  bool bVar2;
  Offset<MyGame::Example::Monster> root;
  SizeT SVar3;
  string local_188;
  string local_168;
  offset_type local_148;
  offset_type local_144;
  SizeT local_140;
  Offset<MyGame::Example::Monster> local_13c;
  SizeT size2;
  Offset<MyGame::Example::Monster> root_offset2;
  GrpcLikeMessageBuilder dst;
  SizeT size1;
  undefined1 local_98 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  GrpcLikeMessageBuilder src;
  bool run_local;
  
  if (run) {
    src.super_FlatBufferBuilder.string_pool._7_1_ = run;
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_98);
    root = populate1((FlatBufferBuilder *)&src);
    dst.super_FlatBufferBuilder.string_pool._0_4_ =
         flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src);
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)&size2);
    local_13c = populate2((FlatBufferBuilder *)&dst);
    local_140 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                          ((FlatBufferBuilderImpl<false> *)&dst);
    GrpcLikeMessageBuilder::Swap
              ((GrpcLikeMessageBuilder *)local_98,(GrpcLikeMessageBuilder *)&size2);
    local_144 = local_13c.o;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)&src,local_13c,(char *)0x0);
    local_148 = root.o;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)&dst,root,(char *)0x0);
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src)
    ;
    TestEq<bool,bool>(local_140 < SVar3,true,"\'src.GetSize() > size2\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb1,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&dst)
    ;
    TestEq<bool,bool>((SizeT)dst.super_FlatBufferBuilder.string_pool < SVar3,true,
                      "\'dst.GetSize() > size1\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb2,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    m2_name_abi_cxx11_();
    CVar1 = m2_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)&src,&local_168,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb3,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_168);
    m1_name_abi_cxx11_();
    CVar1 = m1_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)&dst,&local_188,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,0xb4,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_before_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_188);
    GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)&size2);
    GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_98);
  }
  return;
}

Assistant:

static void builder_swap_before_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      src.Finish(root_offset2);
      dst.Finish(root_offset1);
      TEST_EQ_FUNC(src.GetSize() > size2, true);
      TEST_EQ_FUNC(dst.GetSize() > size1, true);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }